

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O2

ChStrainTensor<double> * __thiscall
chrono::fea::ChElementHexaCorot_8::GetStrain
          (ChStrainTensor<double> *__return_storage_ptr__,ChElementHexaCorot_8 *this,double z1,
          double z2,double z3)

{
  ChMatrixDynamic<> amatrB;
  ChVectorDynamic<> displ;
  double JacobianDet;
  int local_60;
  undefined4 uStack_5c;
  Matrix<double,__1,_1,_0,__1,_1> local_48;
  int local_34;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_30;
  undefined1 local_20 [8];
  
  local_60 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_48,&local_60);
  (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xb])(this,&local_48);
  local_30.m_lhs._0_4_ = 6;
  local_34 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_60,(int *)&local_30,&local_34);
  (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xd])
            (z1,z2,z3,this,&local_60,local_20);
  local_30 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_60,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48);
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_30);
  Eigen::internal::handmade_aligned_free((void *)CONCAT44(uStack_5c,local_60));
  Eigen::internal::handmade_aligned_free
            (local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return __return_storage_ptr__;
}

Assistant:

ChStrainTensor<> ChElementHexaCorot_8::GetStrain(double z1, double z2, double z3) {
    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(GetNdofs());
    this->GetStateBlock(displ);

    double JacobianDet;
    ChMatrixDynamic<> amatrB(6, GetNdofs());
    ComputeMatrB(amatrB, z1, z2, z3, JacobianDet);

    ChStrainTensor<> mstrain = amatrB * displ;
    return mstrain;
}